

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::StructuredAssignmentPatternExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (StructuredAssignmentPatternExpression *this,SampledValueExprVisitor *visitor)

{
  bool bVar1;
  SampledValueExprVisitor *in_RDI;
  IndexSetter *setter_2;
  iterator __end3_2;
  iterator __begin3_2;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *__range3_2;
  TypeSetter *setter_1;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *__range3_1;
  MemberSetter *setter;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  *__range3;
  Expression *in_stack_ffffffffffffff90;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *in_stack_ffffffffffffff98;
  __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
  local_60;
  SampledValueExprVisitor *local_58;
  reference local_50;
  TypeSetter *local_48;
  __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
  local_40;
  bool *local_38;
  reference local_30;
  MemberSetter *local_28;
  __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
  local_20;
  uint16_t *local_18;
  
  local_18 = &in_RDI[2].matchedCode.code;
  local_20._M_current =
       (MemberSetter *)
       std::
       span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
       ::begin((span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                *)in_RDI);
  local_28 = (MemberSetter *)
             std::
             span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
             ::end((span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                    *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
               ::operator*(&local_20);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x7df682);
    Expression::visit<slang::ast::SampledValueExprVisitor&>(in_stack_ffffffffffffff90,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
    ::operator++(&local_20);
  }
  local_38 = &in_RDI[3].isFutureGlobal;
  local_40._M_current =
       (TypeSetter *)
       std::
       span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
       ::begin((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                *)in_RDI);
  local_48 = (TypeSetter *)
             std::
             span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
             ::end((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                    *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
               ::operator*(&local_40);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x7df6fa);
    Expression::visit<slang::ast::SampledValueExprVisitor&>(in_stack_ffffffffffffff90,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  local_58 = in_RDI + 4;
  local_60._M_current =
       (IndexSetter *)
       std::
       span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
       ::begin((span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
                *)in_RDI);
  std::
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff90 =
         (Expression *)
         __gnu_cxx::
         __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
         ::operator*(&local_60);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x7df76e);
    Expression::visit<slang::ast::SampledValueExprVisitor&>(in_stack_ffffffffffffff90,in_RDI);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x7df789);
    Expression::visit<slang::ast::SampledValueExprVisitor&>(in_stack_ffffffffffffff90,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
    ::operator++(&local_60);
  }
  if (*(long *)&in_RDI[4].matchedCode.code != 0) {
    Expression::visit<slang::ast::SampledValueExprVisitor&>(in_stack_ffffffffffffff90,in_RDI);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& setter : memberSetters)
            setter.expr->visit(visitor);
        for (auto& setter : typeSetters)
            setter.expr->visit(visitor);
        for (auto& setter : indexSetters) {
            setter.index->visit(visitor);
            setter.expr->visit(visitor);
        }
        if (defaultSetter)
            defaultSetter->visit(visitor);
    }